

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O0

string * Potassco::string_cast<Clasp::RestartParams::SeqUpdate>(SeqUpdate *num)

{
  string *in_RDI;
  string *out;
  SeqUpdate in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string((string *)in_RDI);
  Clasp::xconvert(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  return in_RDI;
}

Assistant:

std::string string_cast(const U& num) {
	std::string out;
	xconvert(out, num);
	return out;
}